

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_gc(lua_State *L,int what,int data)

{
  lu_byte lVar1;
  global_State *g;
  int iVar2;
  uint uVar3;
  long debt;
  
  uVar3 = 0xffffffff;
  if (9 < (uint)what) {
    return -1;
  }
  g = L->l_G;
  switch(what) {
  case 0:
    g->gcrunning = '\0';
    goto LAB_00108960;
  case 1:
    uVar3 = 0;
    luaE_setdebt(g,0);
    g->gcrunning = '\x01';
    break;
  case 2:
    uVar3 = 0;
    luaC_fullgc(L,0);
    break;
  case 3:
    uVar3 = (uint)((ulong)(g->GCdebt + g->totalbytes) >> 10);
    break;
  case 4:
    uVar3 = (int)g->GCdebt + (int)g->totalbytes & 0x3ff;
    break;
  case 5:
    lVar1 = g->gcrunning;
    g->gcrunning = '\x01';
    if (data == 0) {
      luaE_setdebt(g,-0x960);
      debt = 1;
LAB_00108942:
      luaC_step(L);
    }
    else {
      debt = (long)data * 0x400 + g->GCdebt;
      luaE_setdebt(g,debt);
      if (0 < L->l_G->GCdebt) goto LAB_00108942;
    }
    g->gcrunning = lVar1;
    if (0 < debt) {
      return (uint)(g->gcstate == '\a');
    }
LAB_00108960:
    uVar3 = 0;
    break;
  case 6:
    uVar3 = g->gcpause;
    g->gcpause = data;
    break;
  case 7:
    uVar3 = g->gcstepmul;
    iVar2 = 0x28;
    if (0x28 < data) {
      iVar2 = data;
    }
    g->gcstepmul = iVar2;
    break;
  case 9:
    uVar3 = (uint)g->gcrunning;
  }
  return uVar3;
}

Assistant:

LUA_API int lua_gc(lua_State *L, int what, int data) {
    int res = 0;
    global_State *g;
    lua_lock(L);
    g = G(L);
    switch (what) {
        case LUA_GCSTOP: {
            g->gcrunning = 0;
            break;
        }
        case LUA_GCRESTART: {
            luaE_setdebt(g, 0);
            g->gcrunning = 1;
            break;
        }
        case LUA_GCCOLLECT: {
            luaC_fullgc(L, 0);
            break;
        }
        case LUA_GCCOUNT: {
            /* GC values are expressed in Kbytes: #bytes/2^10 */
            res = cast_int(gettotalbytes(g) >> 10);
            break;
        }
        case LUA_GCCOUNTB: {
            res = cast_int(gettotalbytes(g) & 0x3ff);
            break;
        }
        case LUA_GCSTEP: {
            l_mem debt = 1;  /* =1 to signal that it did an actual step */
            lu_byte oldrunning = g->gcrunning;
            g->gcrunning = 1;  /* allow GC to run */
            if (data == 0) {
                luaE_setdebt(g, -GCSTEPSIZE);  /* to do a "small" step */
                luaC_step(L);
            } else {  /* add 'data' to total debt */
                debt = cast(l_mem, data) * 1024 + g->GCdebt;
                luaE_setdebt(g, debt);
                luaC_checkGC(L);
            }
            g->gcrunning = oldrunning;  /* restore previous state */
            if (debt > 0 && g->gcstate == GCSpause)  /* end of cycle? */
                res = 1;  /* signal it */
            break;
        }
        case LUA_GCSETPAUSE: {
            res = g->gcpause;
            g->gcpause = data;
            break;
        }
        case LUA_GCSETSTEPMUL: {
            res = g->gcstepmul;
            if (data < 40) data = 40;  /* avoid ridiculous low values (and 0) */
            g->gcstepmul = data;
            break;
        }
        case LUA_GCISRUNNING: {
            res = g->gcrunning;
            break;
        }
        default:
            res = -1;  /* invalid option */
    }
    lua_unlock(L);
    return res;
}